

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigCuts.c
# Opt level: O0

void Aig_ObjCutPrint(Aig_ManCut_t *p,Aig_Obj_t *pObj)

{
  int local_24;
  Aig_Cut_t *pAStack_20;
  int i;
  Aig_Cut_t *pCut;
  Aig_Obj_t *pObj_local;
  Aig_ManCut_t *p_local;
  
  printf("Cuts for node %d:\n",(ulong)(uint)pObj->Id);
  local_24 = 0;
  pAStack_20 = Aig_ObjCuts(p,pObj);
  while (local_24 < p->nCutsMax) {
    if (pAStack_20->nFanins != '\0') {
      Aig_CutPrint(pAStack_20);
    }
    local_24 = local_24 + 1;
    pAStack_20 = Aig_CutNext(pAStack_20);
  }
  return;
}

Assistant:

void Aig_ObjCutPrint( Aig_ManCut_t * p, Aig_Obj_t * pObj )
{
    Aig_Cut_t * pCut;
    int i;
    printf( "Cuts for node %d:\n", pObj->Id );
    Aig_ObjForEachCut( p, pObj, pCut, i )
        if ( pCut->nFanins )
            Aig_CutPrint( pCut );
//    printf( "\n" );
}